

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5SocketEngine::setMulticastInterface(QSocks5SocketEngine *this,QNetworkInterface *param_2)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  char *in_stack_ffffffffffffffb8;
  SocketError error;
  QString *this_00;
  QLatin1StringView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffffb8,(size_t)in_RDI);
  error = (SocketError)((ulong)&stack0xffffffffffffffe0 >> 0x20);
  this_00 = (QString *)QVar2.m_size;
  QString::QString(this_00,in_stack_ffffffffffffffe0);
  QAbstractSocketEngine::setError((QAbstractSocketEngine *)this_00,error,in_RDI);
  QString::~QString((QString *)0x37440c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5SocketEngine::setMulticastInterface(const QNetworkInterface &)
{
    setError(QAbstractSocket::UnsupportedSocketOperationError,
             "Operation on socket is not supported"_L1);
    return false;
}